

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_set_vector_Test::~ObjectTest_basic_set_vector_Test
          (ObjectTest_basic_set_vector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_vector) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::vector<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<short>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<int>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<float>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<object>);
}